

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoodsByAutoPartitionAsync
          (BeagleCPUImpl<double,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *categoryWeightsIndices,int *stateFrequenciesIndices,
          int *cumulativeScaleIndices,int *partitionIndices,double *outSumLogLikelihoodByPartition)

{
  offset_in_BeagleCPUImpl<double,_1,_0>_to_subr *poVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  threadData *ptVar2;
  undefined1 auVar3 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  long lVar5;
  long lVar6;
  long lVar7;
  unique_lock<std::mutex> l;
  undefined1 local_101;
  BeagleCPUImpl<double,_1,_0> *local_100;
  packaged_task<void_()> local_f8;
  _Task_state<std::_Bind<void_(beagle::cpu::BeagleCPUImpl<double,_1,_0>::*(beagle::cpu::BeagleCPUImpl<double,_1,_0>_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*))(const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*)>,_std::allocator<int>,_void_()>
  *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_e0 [2];
  int *local_d0;
  int *local_c8;
  int *local_c0;
  int *local_b8;
  int *local_b0;
  int *local_a8;
  long local_a0;
  undefined1 local_98 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  _Tuple_impl<9UL,_double_*> local_88;
  _Head_base<8UL,_int,_false> local_80;
  _Head_base<7UL,_const_int_*,_false> local_78;
  _Head_base<6UL,_const_int_*,_false> local_70;
  _Head_base<5UL,_const_int_*,_false> local_68;
  _Head_base<4UL,_const_int_*,_false> local_60;
  _Head_base<3UL,_const_int_*,_false> local_58;
  _Head_base<2UL,_const_int_*,_false> local_50;
  _Head_base<1UL,_const_int_*,_false> local_48;
  _Head_base<0UL,_beagle::cpu::BeagleCPUImpl<double,_1,_0>_*,_false> local_40;
  
  local_d0 = parentBufferIndices;
  local_c8 = childBufferIndices;
  local_c0 = probabilityIndices;
  local_b8 = categoryWeightsIndices;
  local_b0 = stateFrequenciesIndices;
  if (0 < this->kNumThreads) {
    lVar5 = 0x88;
    lVar7 = 0;
    lVar6 = 0;
    local_100 = this;
    do {
      local_88.super__Head_base<9UL,_double_*,_false>._M_head_impl =
           (_Head_base<9UL,_double_*,_false>)((long)outSumLogLikelihoodByPartition + lVar7);
      local_98 = (undefined1  [8])0x279;
      p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_80._M_head_impl = 1;
      local_70._M_head_impl = cumulativeScaleIndices;
      local_68._M_head_impl = local_b0;
      local_60._M_head_impl = local_b8;
      local_58._M_head_impl = local_c0;
      local_50._M_head_impl = local_c8;
      local_48._M_head_impl = local_d0;
      local_e8 = (_Task_state<std::_Bind<void_(beagle::cpu::BeagleCPUImpl<double,_1,_0>::*(beagle::cpu::BeagleCPUImpl<double,_1,_0>_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*))(const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*)>,_std::allocator<int>,_void_()>
                  *)0x0;
      local_a8 = partitionIndices;
      local_a0 = lVar6;
      local_78._M_head_impl = partitionIndices;
      local_40._M_head_impl = this;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::__future_base::_Task_state<std::_Bind<void(beagle::cpu::BeagleCPUImpl<double,1,0>::*(beagle::cpu::BeagleCPUImpl<double,1,0>*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*))(int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*)>,std::allocator<int>,void()>,std::allocator<int>,std::_Bind<void(beagle::cpu::BeagleCPUImpl<double,1,0>::*(beagle::cpu::BeagleCPUImpl<double,1,0>*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*))(int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*)>,std::allocator<int>const&>
                (a_Stack_e0,&local_e8,(allocator<int> *)&local_101,
                 (_Bind<void_(beagle::cpu::BeagleCPUImpl<double,_1,_0>::*(beagle::cpu::BeagleCPUImpl<double,_1,_0>_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*))(const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*)>
                  *)local_98,(allocator<int> *)&local_101);
      local_f8._M_state.
      super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = &local_e8->super__Task_state_base<void_()>;
      local_f8._M_state.
      super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = a_Stack_e0[0]._M_pi;
      std::packaged_task<void_()>::get_future((packaged_task<void_()> *)local_98);
      p_Var4 = p_Stack_90;
      auVar3 = local_98;
      local_98 = (undefined1  [8])0x0;
      p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(this->gFutures->super___basic_future<void>)._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + lVar7 * 2);
      poVar1 = (offset_in_BeagleCPUImpl<double,_1,_0>_to_subr *)
               ((long)&(this->gFutures->super___basic_future<void>)._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + lVar7 * 2);
      *poVar1 = (offset_in_BeagleCPUImpl<double,_1,_0>_to_subr)auVar3;
      poVar1[1] = (offset_in_BeagleCPUImpl<double,_1,_0>_to_subr)p_Var4;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
      }
      ptVar2 = local_100->gThreads;
      local_98 = (undefined1  [8])((long)&(ptVar2->t)._M_id._M_thread + lVar5);
      p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((ulong)p_Stack_90 & 0xffffffffffffff00);
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_98);
      p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(p_Stack_90._1_7_,1);
      parentBufferIndices = (int *)&local_f8;
      std::deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>>::
      emplace_back<std::packaged_task<void()>>
                ((deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>> *)
                 ((long)ptVar2 + lVar5 + -0x80),(packaged_task<void_()> *)parentBufferIndices);
      lVar6 = local_a0;
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_98);
      this = local_100;
      std::condition_variable::notify_one();
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_98);
      std::packaged_task<void_()>::~packaged_task(&local_f8);
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0xb8;
      lVar7 = lVar7 + 8;
      partitionIndices = local_a8 + 1;
    } while (lVar6 < this->kNumThreads);
  }
  if (0 < this->kNumThreads) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      std::__basic_future<void>::wait
                ((__basic_future<void> *)
                 ((long)&(this->gFutures->super___basic_future<void>)._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + lVar6),parentBufferIndices);
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar5 < this->kNumThreads);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsByAutoPartitionAsync(
                                                        const int* parentBufferIndices,
                                                        const int* childBufferIndices,
                                                        const int* probabilityIndices,
                                                        const int* categoryWeightsIndices,
                                                        const int* stateFrequenciesIndices,
                                                        const int* cumulativeScaleIndices,
                                                        const int* partitionIndices,
                                                        double* outSumLogLikelihoodByPartition) {

    for (int i=0; i<kNumThreads; i++) {

        std::packaged_task<void()> threadTask(
            std::bind(&BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsByPartition, this,
                      parentBufferIndices,
                      childBufferIndices,
                      probabilityIndices,
                      categoryWeightsIndices,
                      stateFrequenciesIndices,
                      cumulativeScaleIndices,
                      &partitionIndices[i],
                      1,
                      &outSumLogLikelihoodByPartition[i]));

        gFutures[i] = threadTask.get_future();
        threadData* td = &gThreads[i];

        std::unique_lock<std::mutex> l(td->m);
        td->jobs.push(std::move(threadTask));
        l.unlock();

        gThreads[i].cv.notify_one();
    }

    for (int i=0; i<kNumThreads; i++) {
        gFutures[i].wait();
    }

}